

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::ListBindFunction
          (ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  LogicalTypeId LVar1;
  pointer pEVar2;
  reference other;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  LogicalType *in_stack_ffffffffffffff68;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> this;
  LogicalType *in_stack_ffffffffffffff88;
  LogicalType local_60 [40];
  LogicalType local_38 [56];
  
  this._M_head_impl =
       (FunctionData *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_RDI._M_t.
                  super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
                  .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl,
               (size_type)in_stack_ffffffffffffff68);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)this._M_head_impl);
  LVar1 = LogicalType::id((LogicalType *)(pEVar2 + 0x38));
  if (LVar1 == UNKNOWN) {
    duckdb::LogicalType::LogicalType(local_38,UNKNOWN);
    other = vector<duckdb::LogicalType,_true>::operator[]
                      ((vector<duckdb::LogicalType,_true> *)this._M_head_impl,
                       (size_type)in_stack_ffffffffffffff68);
    LogicalType::operator=((LogicalType *)this._M_head_impl,other);
    duckdb::LogicalType::~LogicalType(local_38);
    duckdb::LogicalType::LogicalType(local_60,SQLNULL);
    LogicalType::operator=((LogicalType *)this._M_head_impl,other);
    duckdb::LogicalType::~LogicalType(local_60);
    unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
    unique_ptr<std::default_delete<duckdb::FunctionData>,void>
              ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
               this._M_head_impl,other);
  }
  else {
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)this._M_head_impl,(size_type)in_stack_ffffffffffffff68);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               this._M_head_impl);
    duckdb::LogicalType::LIST((LogicalType *)&stack0xffffffffffffff88);
    LogicalType::operator=((LogicalType *)this._M_head_impl,in_stack_ffffffffffffff68);
    duckdb::LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffff88);
    make_uniq<duckdb::ListBindData,duckdb::LogicalType&>(in_stack_ffffffffffffff88);
    unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
    unique_ptr<duckdb::ListBindData,std::default_delete<std::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>>>,void>
              ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
               this._M_head_impl,
               (unique_ptr<duckdb::ListBindData,_std::default_delete<duckdb::ListBindData>_> *)
               in_stack_ffffffffffffff68);
    unique_ptr<duckdb::ListBindData,_std::default_delete<duckdb::ListBindData>,_true>::~unique_ptr
              ((unique_ptr<duckdb::ListBindData,_std::default_delete<duckdb::ListBindData>,_true> *)
               0xb416db);
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<FunctionData> ListBindFunction(ClientContext &context, AggregateFunction &function,
                                          vector<unique_ptr<Expression>> &arguments) {
	D_ASSERT(arguments.size() == 1);
	D_ASSERT(function.arguments.size() == 1);

	if (arguments[0]->return_type.id() == LogicalTypeId::UNKNOWN) {
		function.arguments[0] = LogicalTypeId::UNKNOWN;
		function.return_type = LogicalType::SQLNULL;
		return nullptr;
	}

	function.return_type = LogicalType::LIST(arguments[0]->return_type);
	return make_uniq<ListBindData>(function.return_type);
}